

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O2

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Player>
          (TIA *this,Player *object,uint8_t collision_identity,int start,int end,int time_now)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int from_horizontal_counter;
  int iVar4;
  uint uVar5;
  int iVar6;
  int start_00;
  int iVar7;
  int count;
  
  iVar3 = (object->super_Object<Atari2600::TIA::Player>).motion_time + -0x40;
  do {
    start_00 = start;
    iVar4 = end;
    if (iVar3 < end) {
      iVar4 = iVar3;
    }
LAB_002cf02b:
    if (end <= start_00) {
      return;
    }
    iVar6 = end;
    if ((object->super_Object<Atari2600::TIA::Player>).is_moving != false) {
      iVar6 = iVar4;
    }
    uVar1 = (object->super_Object<Atari2600::TIA::Player>).position;
    uVar2 = object->copy_flags;
    uVar5 = 0;
    iVar7 = 0xa0;
    if (uVar2 != 0) {
      iVar7 = 0x10;
      uVar5 = 1;
      if (((byte)uVar2 & (int)uVar1 < 0x10) == 0) {
        if ((int)uVar1 < 0x20) {
          iVar7 = 0x20;
          uVar5 = 2;
          if ((uVar2 & 2) == 0) {
LAB_002cf085:
            iVar7 = 0x40;
            if ((uVar2 & 4) == 0) {
              iVar7 = 0xa0;
            }
            uVar5 = (int)(uVar2 << 0x1d) >> 0x1f & 3;
          }
        }
        else {
          iVar7 = 0xa0;
          uVar5 = 0;
          if (uVar1 < 0x40) goto LAB_002cf085;
        }
      }
    }
    iVar7 = (iVar7 + start_00) - uVar1;
    start = iVar6;
    if (iVar7 < iVar6) {
      start = iVar7;
    }
    count = start - start_00;
    if ((object->enqueues == true) && (time_now < start)) {
      if (time_now - start_00 == 0 || time_now < start_00) {
        from_horizontal_counter = start_00 + 0x40;
      }
      else {
        Player::output_pixels
                  (object,this->collision_buffer_ + start_00,time_now - start_00,collision_identity,
                   start_00 + 0x40);
        from_horizontal_counter = time_now + 0x40;
        start_00 = time_now;
      }
      Player::enqueue_pixels(object,start_00,start,from_horizontal_counter);
    }
    else {
      Player::output_pixels
                (object,this->collision_buffer_ + start_00,count,collision_identity,start_00 + 0x40)
      ;
    }
    (object->super_Object<Atari2600::TIA::Player>).position =
         (count + (object->super_Object<Atari2600::TIA::Player>).position) % 0xa0;
    if (((object->super_Object<Atari2600::TIA::Player>).is_moving != true) || (start != iVar3)) {
      start_00 = start;
      if (iVar7 <= iVar6) {
        object->pixel_position = 0;
        object->pixel_counter = 0;
        object->copy_index_ = uVar5;
      }
      goto LAB_002cf02b;
    }
    perform_motion_step<Atari2600::TIA::Player>(this,object);
    iVar3 = iVar3 + 4;
  } while( true );
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}